

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DB::Open(DB *this,Options *options,string *dbname,DB **dbptr)

{
  Env *pEVar1;
  Comparator *number;
  _func_int **pp_Var2;
  int iVar3;
  DBImpl *this_00;
  Env *pEVar4;
  Writer *this_01;
  MemTable *this_02;
  long in_FS_OFFSET;
  WritableFile *lfile;
  bool save_manifest;
  VersionEdit edit;
  DB local_118;
  WritableFile *local_110;
  char local_101;
  undefined1 local_100 [32];
  VersionEdit local_e0;
  pointer local_38;
  
  local_38 = *(pointer *)(in_FS_OFFSET + 0x28);
  *dbptr = (DB *)0x0;
  this_00 = (DBImpl *)operator_new(0x2e0);
  DBImpl::DBImpl(this_00,options,dbname);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this_00->mutex_);
  if (iVar3 != 0) {
    if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_system_error(iVar3);
      goto LAB_00d146ee;
    }
    goto LAB_00d147ba;
  }
  VersionEdit::VersionEdit(&local_e0);
  local_101 = '\0';
  DBImpl::Recover((DBImpl *)this,(VersionEdit *)this_00,(bool *)&local_e0);
  if (this->_vptr_DB == (_func_int **)0x0) {
    if (this_00->mem_ == (MemTable *)0x0) {
      number = (Comparator *)this_00->versions_->next_file_number_;
      this_00->versions_->next_file_number_ = (uint64_t)((long)&number->_vptr_Comparator + 1);
      pEVar1 = options->env;
      LogFileName((string *)local_100,dbname,(uint64_t)number);
      (*pEVar1->_vptr_Env[4])(&local_118,pEVar1,local_100,&local_110);
      pp_Var2 = this->_vptr_DB;
      this->_vptr_DB = (_func_int **)local_118;
      local_118._vptr_DB = pp_Var2;
      if (pp_Var2 != (_func_int **)0x0) {
        operator_delete__(pp_Var2);
      }
      if ((Env *)local_100._0_8_ != (Env *)(local_100 + 0x10)) {
        operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
      }
      if (this->_vptr_DB == (_func_int **)0x0) {
        local_e0.has_log_number_ = true;
        this_00->logfile_ = local_110;
        this_00->logfile_number_ = (uint64_t)number;
        local_e0.log_number_ = (uint64_t)number;
        this_01 = (Writer *)operator_new(0x20);
        log::Writer::Writer(this_01,local_110);
        this_00->log_ = this_01;
        this_02 = (MemTable *)operator_new(0x70);
        MemTable::MemTable(this_02,&this_00->internal_comparator_);
        this_02->refs_ = this_02->refs_ + 1;
        this_00->mem_ = this_02;
        if (this->_vptr_DB == (_func_int **)0x0) goto LAB_00d1450e;
      }
    }
    else {
LAB_00d1450e:
      if (local_101 == '\x01') {
        local_e0.has_prev_log_number_ = true;
        local_e0.prev_log_number_ = 0;
        local_e0.log_number_ = this_00->logfile_number_;
        local_e0.has_log_number_ = true;
        VersionSet::LogAndApply
                  ((VersionSet *)local_100,(VersionEdit *)this_00->versions_,(Mutex *)&local_e0);
        pEVar1 = (Env *)this->_vptr_DB;
        this->_vptr_DB = (_func_int **)local_100._0_8_;
        pEVar4 = (Env *)local_100._0_8_;
        local_100._0_8_ = pEVar1;
        if (pEVar1 != (Env *)0x0) {
          operator_delete__(pEVar1);
          pEVar4 = (Env *)this->_vptr_DB;
        }
        if (pEVar4 != (Env *)0x0) goto LAB_00d1466f;
      }
      DBImpl::DeleteObsoleteFiles(this_00);
      DBImpl::MaybeScheduleCompaction(this_00);
    }
  }
LAB_00d1466f:
  pthread_mutex_unlock((pthread_mutex_t *)&this_00->mutex_);
  if (this->_vptr_DB == (_func_int **)0x0) {
    if (this_00->mem_ == (MemTable *)0x0) {
LAB_00d146ee:
      __assert_fail("impl->mem_ != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                    ,0x5ea,
                    "static Status leveldb::DB::Open(const Options &, const std::string &, DB **)");
    }
    *dbptr = (DB *)this_00;
  }
  else {
    (*(this_00->super_DB)._vptr_DB[1])(this_00);
  }
  VersionEdit::~VersionEdit(&local_e0);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
LAB_00d147ba:
  __stack_chk_fail();
}

Assistant:

Status DB::Open(const Options& options, const std::string& dbname, DB** dbptr) {
  *dbptr = nullptr;

  DBImpl* impl = new DBImpl(options, dbname);
  impl->mutex_.Lock();
  VersionEdit edit;
  // Recover handles create_if_missing, error_if_exists
  bool save_manifest = false;
  Status s = impl->Recover(&edit, &save_manifest);
  if (s.ok() && impl->mem_ == nullptr) {
    // Create new log and a corresponding memtable.
    uint64_t new_log_number = impl->versions_->NewFileNumber();
    WritableFile* lfile;
    s = options.env->NewWritableFile(LogFileName(dbname, new_log_number),
                                     &lfile);
    if (s.ok()) {
      edit.SetLogNumber(new_log_number);
      impl->logfile_ = lfile;
      impl->logfile_number_ = new_log_number;
      impl->log_ = new log::Writer(lfile);
      impl->mem_ = new MemTable(impl->internal_comparator_);
      impl->mem_->Ref();
    }
  }
  if (s.ok() && save_manifest) {
    edit.SetPrevLogNumber(0);  // No older logs needed after recovery.
    edit.SetLogNumber(impl->logfile_number_);
    s = impl->versions_->LogAndApply(&edit, &impl->mutex_);
  }
  if (s.ok()) {
    impl->DeleteObsoleteFiles();
    impl->MaybeScheduleCompaction();
  }
  impl->mutex_.Unlock();
  if (s.ok()) {
    assert(impl->mem_ != nullptr);
    *dbptr = impl;
  } else {
    delete impl;
  }
  return s;
}